

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

void __thiscall boost::deflate::error_test::run(error_test *this)

{
  check(this,"boost.deflate",need_buffers);
  check(this,"boost.deflate",end_of_stream);
  check(this,"boost.deflate",need_dict);
  check(this,"boost.deflate",stream_error);
  check(this,"boost.deflate",invalid_block_type);
  check(this,"boost.deflate",invalid_stored_length);
  check(this,"boost.deflate",too_many_symbols);
  check(this,"boost.deflate",invalid_code_lengths);
  check(this,"boost.deflate",invalid_bit_length_repeat);
  check(this,"boost.deflate",missing_eob);
  check(this,"boost.deflate",invalid_literal_length);
  check(this,"boost.deflate",invalid_distance_code);
  check(this,"boost.deflate",invalid_distance);
  check(this,"boost.deflate",incorrect_header_check);
  check(this,"boost.deflate",incorrect_data_check);
  check(this,"boost.deflate",incorrect_length_check);
  check(this,"boost.deflate",unknown_compression_method);
  check(this,"boost.deflate",invalid_window_size);
  check(this,"boost.deflate",header_crc_mismatch);
  check(this,"boost.deflate",over_subscribed_length);
  check(this,"boost.deflate",incomplete_length_set);
  check(this,"boost.deflate",general);
  return;
}

Assistant:

void run()
    {
        check("boost.deflate", error::need_buffers);
        check("boost.deflate", error::end_of_stream);
        check("boost.deflate", error::need_dict);
        check("boost.deflate", error::stream_error);

        check("boost.deflate", error::invalid_block_type);
        check("boost.deflate", error::invalid_stored_length);
        check("boost.deflate", error::too_many_symbols);
        check("boost.deflate", error::invalid_code_lengths);
        check("boost.deflate", error::invalid_bit_length_repeat);
        check("boost.deflate", error::missing_eob);
        check("boost.deflate", error::invalid_literal_length);
        check("boost.deflate", error::invalid_distance_code);
        check("boost.deflate", error::invalid_distance);

        check("boost.deflate", error::incorrect_header_check);
        check("boost.deflate", error::incorrect_data_check);
        check("boost.deflate", error::incorrect_length_check);
        check("boost.deflate", error::unknown_compression_method);
        check("boost.deflate", error::invalid_window_size);
        check("boost.deflate", error::header_crc_mismatch);

        check("boost.deflate", error::over_subscribed_length);
        check("boost.deflate", error::incomplete_length_set);

        check("boost.deflate", error::general);
    }